

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O1

void __thiscall Automaton::buildReadsDigraph(Automaton *this)

{
  Name *this_00;
  Name *this_01;
  Grammar *pGVar1;
  Node<Read> *this_02;
  const_iterator cVar2;
  _List_node_base *p_Var3;
  iterator iVar4;
  iterator iVar5;
  iterator other;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  Name extraout_RDX;
  Name extraout_RDX_00;
  Node<Read> *this_03;
  long in_FS_OFFSET;
  Read data;
  Read data_00;
  Name sym;
  key_type local_48;
  key_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = (Node<Read> *)
            (this->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (this_03 != (Node<Read> *)&this->states) {
    do {
      this_00 = &this_03[1].data.nt;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      p_Var7 = (_Rb_tree_node_base *)this_03[1].data.nt._M_node[2]._M_next;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      p_Var3 = this_03[1].data.nt._M_node;
      while (p_Var7 != (_Rb_tree_node_base *)(p_Var3 + 1)) {
        pGVar1 = this->_M_grammar;
        local_40._M_node = *(_List_node_base **)(p_Var7 + 1);
        cVar2 = std::
                _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                ::find(&(pGVar1->non_terminals)._M_t,&local_40);
        if ((_Rb_tree_header *)cVar2._M_node !=
            &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
          this_02 = (Node<Read> *)p_Var7[1]._M_parent;
          this_01 = &this_02[1].data.nt;
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01);
          p_Var6 = (_Rb_tree_node_base *)this_02[1].data.nt._M_node[2]._M_next;
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01);
          p_Var3 = this_02[1].data.nt._M_node;
          while (p_Var6 != (_Rb_tree_node_base *)(p_Var3 + 1)) {
            local_48._M_node = *(_List_node_base **)(p_Var6 + 1);
            pGVar1 = this->_M_grammar;
            local_40._M_node = local_48._M_node;
            cVar2 = std::
                    _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                    ::find(&(pGVar1->non_terminals)._M_t,&local_40);
            if ((_Rb_tree_header *)cVar2._M_node !=
                &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
              iVar4 = std::
                      _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      ::find(&(this->nullables)._M_t,&local_48);
              if ((_Rb_tree_header *)iVar4._M_node !=
                  &(this->nullables)._M_t._M_impl.super__Rb_tree_header) {
                data.nt._M_node = extraout_RDX._M_node;
                data.state._M_node = *(_List_node_base **)(p_Var7 + 1);
                iVar5 = Node<Read>::get(this_03,data);
                data_00.nt._M_node = extraout_RDX_00._M_node;
                data_00.state._M_node = local_48._M_node;
                other = Node<Read>::get(this_02,data_00);
                Node<Read>::insertEdge((Node<Read> *)(iVar5._M_node + 1),other);
              }
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                      ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01);
            p_Var3 = this_01->_M_node;
          }
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                  ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
        p_Var3 = this_00->_M_node;
      }
      this_03 = *(Node<Read> **)this_03;
    } while (this_03 != (Node<Read> *)&this->states);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::buildReadsDigraph ()
{
  for (StatePointer q = states.begin (); q != states.end (); ++q)
    {
      for (Bundle::iterator a = q->bundle.begin (); a != q->bundle.end (); ++a)
        {
          if (! _M_grammar->isNonTerminal (a.key ()))
            continue;

          StatePointer r = a.value ();

          for (Bundle::iterator z = r->bundle.begin (); z != r->bundle.end (); ++z)
            {
              Name sym = z.key ();

              if (! _M_grammar->isNonTerminal(sym) || nullables.find (sym) == nullables.end ())
                continue;

              ReadsGraph::iterator source = ReadsGraph::get (Read (q, a.key ()));
              ReadsGraph::iterator target = ReadsGraph::get (Read (r, sym));

              source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_READS
              qerr() << "*** ";
              dump (qerr(), source);
              qerr() << " reads ";
              dump (qerr(), target);
              qerr() << Qt::endl;
#endif
            }
        }
    }
}